

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TabItemBackground(ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImU32 col)

{
  float fVar1;
  ImVec2 *pIVar2;
  ImGuiContext *pIVar3;
  ImU32 col_00;
  ImVec2 *pIVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ImVec2 local_50;
  undefined1 local_48 [16];
  
  pIVar3 = GImGui;
  fVar10 = (bb->Min).x;
  fVar1 = (bb->Min).y;
  fVar9 = (GImGui->Style).TabRounding;
  fVar8 = ((bb->Max).x - fVar10) * 0.5 + -1.0;
  if (fVar8 <= fVar9) {
    fVar9 = fVar8;
  }
  fVar8 = (bb->Max).y + -1.0;
  local_48 = ZEXT416(~-(uint)(fVar9 <= 0.0) & (uint)fVar9);
  iVar6 = (draw_list->_Path).Size;
  if (iVar6 == (draw_list->_Path).Capacity) {
    if (iVar6 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar6 / 2 + iVar6;
    }
    iVar7 = iVar6 + 1;
    if (iVar6 + 1 < iVar5) {
      iVar7 = iVar5;
    }
    pIVar4 = (ImVec2 *)MemAlloc((long)iVar7 << 3);
    pIVar2 = (draw_list->_Path).Data;
    if (pIVar2 != (ImVec2 *)0x0) {
      memcpy(pIVar4,pIVar2,(long)(draw_list->_Path).Size << 3);
      MemFree((draw_list->_Path).Data);
    }
    (draw_list->_Path).Data = pIVar4;
    (draw_list->_Path).Capacity = iVar7;
    iVar6 = (draw_list->_Path).Size;
  }
  else {
    pIVar4 = (draw_list->_Path).Data;
  }
  pIVar4[iVar6].x = fVar10;
  pIVar4[iVar6].y = fVar8;
  (draw_list->_Path).Size = (draw_list->_Path).Size + 1;
  local_50.x = (bb->Min).x + (float)local_48._0_4_;
  fVar10 = fVar1 + 1.0 + (float)local_48._0_4_;
  local_50.y = fVar10;
  ImDrawList::PathArcToFast(draw_list,&local_50,(float)local_48._0_4_,6,9);
  local_50.x = (bb->Max).x - (float)local_48._0_4_;
  local_50.y = fVar10;
  ImDrawList::PathArcToFast(draw_list,&local_50,(float)local_48._0_4_,9,0xc);
  fVar10 = (bb->Max).x;
  iVar6 = (draw_list->_Path).Size;
  if (iVar6 == (draw_list->_Path).Capacity) {
    if (iVar6 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar6 / 2 + iVar6;
    }
    iVar7 = iVar6 + 1;
    if (iVar6 + 1 < iVar5) {
      iVar7 = iVar5;
    }
    pIVar4 = (ImVec2 *)MemAlloc((long)iVar7 << 3);
    pIVar2 = (draw_list->_Path).Data;
    if (pIVar2 != (ImVec2 *)0x0) {
      memcpy(pIVar4,pIVar2,(long)(draw_list->_Path).Size << 3);
      MemFree((draw_list->_Path).Data);
    }
    (draw_list->_Path).Data = pIVar4;
    (draw_list->_Path).Capacity = iVar7;
    iVar6 = (draw_list->_Path).Size;
  }
  else {
    pIVar4 = (draw_list->_Path).Data;
  }
  pIVar4[iVar6].x = fVar10;
  pIVar4[iVar6].y = fVar8;
  iVar6 = (draw_list->_Path).Size + 1;
  (draw_list->_Path).Size = iVar6;
  ImDrawList::AddConvexPolyFilled(draw_list,(draw_list->_Path).Data,iVar6,col);
  if (0.0 < (pIVar3->Style).TabBorderSize) {
    pIVar4 = (draw_list->_Path).Data;
    iVar6 = (draw_list->_Path).Size;
    col_00 = GetColorU32(5,1.0);
    ImDrawList::AddPolyline(draw_list,pIVar4,iVar6,col_00,false,(pIVar3->Style).TabBorderSize);
  }
  (draw_list->_Path).Size = 0;
  return;
}

Assistant:

void ImGui::TabItemBackground(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImU32 col)
{
    // While rendering tabs, we trim 1 pixel off the top of our bounding box so they can fit within a regular frame height while looking "detached" from it.
    (void)flags;
    ImGuiContext& g = *GImGui;
    const float width = bb.GetWidth();
    IM_ASSERT(width > 0.0f);
    const float rounding = ImMax(0.0f, ImMin(g.Style.TabRounding, width * 0.5f - 1.0f));
    float y1 = bb.Min.y + 1.0f;
    float y2 = bb.Max.y - 1.0f;
    draw_list->PathLineTo(ImVec2(bb.Min.x, y2));
    draw_list->PathArcToFast(ImVec2(bb.Min.x + rounding, y1 + rounding), rounding, 6, 9);
    draw_list->PathArcToFast(ImVec2(bb.Max.x - rounding, y1 + rounding), rounding, 9, 12);
    draw_list->PathLineTo(ImVec2(bb.Max.x, y2));
    draw_list->AddConvexPolyFilled(draw_list->_Path.Data, draw_list->_Path.Size, col);
    if (g.Style.TabBorderSize > 0.0f)
        draw_list->AddPolyline(draw_list->_Path.Data, draw_list->_Path.Size, GetColorU32(ImGuiCol_Border), false, g.Style.TabBorderSize);
    draw_list->PathClear();
}